

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

char * google::ProgramInvocationShortName(void)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = std::__cxx11::string::rfind('`',0x2f);
  pcVar2 = argv0_abi_cxx11_ + lVar1 + 1;
  if (lVar1 == -1) {
    pcVar2 = argv0_abi_cxx11_;
  }
  return pcVar2;
}

Assistant:

const char* ProgramInvocationShortName() {        // like the GNU libc fn
  size_t pos = argv0.rfind('/');
#ifdef OS_WINDOWS
  if (pos == string::npos) pos = argv0.rfind('\\');
#endif
  return (pos == string::npos ? argv0.c_str() : (argv0.c_str() + pos + 1));
}